

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int i;
  int dim;
  Matrix33<double> A3;
  Matrix33<double> A2;
  Matrix33<double> A1;
  T threshold;
  Matrix33<double> V;
  Matrix33<double> U;
  TV S;
  TV maxV;
  TV minV;
  int local_1c8;
  Matrix33 local_1c0 [16];
  Matrix33<double> *in_stack_fffffffffffffe50;
  Matrix33<double> local_178;
  Matrix33<double> local_130;
  BaseType_conflict3 local_e8;
  Matrix33<double> local_e0;
  Matrix33<double> local_98;
  Vec3<double> local_50;
  Vec3<double> local_38;
  Vec3<double> local_20;
  Matrix33<double> *local_8;
  
  local_8 = in_RDI;
  Imath_3_2::Vec3<double>::Vec3(&local_20);
  Imath_3_2::Vec3<double>::Vec3(&local_38);
  Imath_3_2::Vec3<double>::Vec3(&local_50);
  Imath_3_2::Matrix33<double>::Matrix33(&local_98);
  Imath_3_2::Matrix33<double>::Matrix33(&local_e0);
  local_e8 = computeThreshold<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffe50);
  Imath_3_2::Matrix33<double>::Matrix33(&local_130,local_8);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
            ((Matrix33 *)&local_130,(Vec3 *)&local_20);
  Imath_3_2::Matrix33<double>::Matrix33(&local_178,local_8);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
            ((Matrix33 *)&local_178,(Vec3 *)&local_38);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)local_1c0,local_8);
  dVar2 = std::numeric_limits<double>::epsilon();
  Imath_3_2::jacobiSVD<double>
            (local_1c0,(Matrix33 *)&local_98,(Vec3 *)&local_50,(Matrix33 *)&local_e0,dVar2,false);
  local_1c8 = 0;
  while( true ) {
    if (2 < local_1c8) {
      return;
    }
    Imath_3_2::Vec3<double>::operator[](&local_20,local_1c8);
    pMVar1 = &local_e0;
    Imath_3_2::Matrix33<double>::operator[](pMVar1,local_1c8);
    std::abs((int)pMVar1);
    if (local_e8 <= extraout_XMM0_Qa) break;
    Imath_3_2::Vec3<double>::operator[](&local_38,local_1c8);
    pMVar1 = &local_e0;
    Imath_3_2::Matrix33<double>::operator[](pMVar1,local_1c8);
    std::abs((int)pMVar1);
    if (local_e8 <= extraout_XMM0_Qa_00) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]"
                   );
    }
    local_1c8 = local_1c8 + 1;
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}